

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::buffer::trim(buffer *this,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  _func_void_void_ptr *p_Var3;
  ulong uVar4;
  type_traits *ptVar5;
  ulong local_50;
  size_t i;
  uint8_t *base;
  _func_void_void_ptr *fini;
  size_t size;
  type_traits *traits;
  size_t used;
  size_t len_local;
  buffer *this_local;
  
  if (this->_used < len) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = this->_used;
    uVar4 = uVar1 - len;
    ptVar5 = content_traits(this);
    if (ptVar5 != (type_traits *)0x0) {
      uVar2 = ptVar5->size;
      if (((uVar2 == 0) || (uVar1 % uVar2 != 0)) || (uVar4 % uVar2 != 0)) {
        return false;
      }
      p_Var3 = ptVar5->fini;
      if (p_Var3 != (_func_void_void_ptr *)0x0) {
        for (local_50 = uVar4; local_50 < uVar1; local_50 = uVar2 + local_50) {
          (*p_Var3)((void *)((long)this + local_50 + uVar4 + 0x20));
        }
      }
    }
    this->_used = uVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool buffer::trim(size_t len)
{
	if (_used < len) {
		return false;
	}
	size_t used = _used;
	len = used - len;
	const struct type_traits *traits = content_traits();
	if (traits) {
		size_t size;
		if (!(size = traits->size)
		 || used % size
		 || len % size) {
			return false;
		}
		void (*fini)(void *);
		if ((fini = traits->fini)) {
			uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1)) + len;
			for (size_t i = len; i < used; i += size) {
				fini(base + i);
			}
		}
	}
	_used = len;
	return true;
}